

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HatchetSampleProfileController.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3efbf9::HatchetSampleProfileController::HatchetSampleProfileController
          (HatchetSampleProfileController *this,char *name,config_map_t *initial_cfg,Options *opts,
          string *format_spec)

{
  bool bVar1;
  config_map_t *pcVar2;
  mapped_type *pmVar3;
  string *psVar4;
  info_map_t *metadata;
  double dVar5;
  bool local_46a;
  bool local_431;
  char *local_420;
  allocator<char> local_3d1;
  key_type local_3d0;
  string local_3b0;
  allocator<char> local_389;
  key_type local_388;
  allocator<char> local_361;
  key_type local_360;
  allocator<char> local_339;
  key_type local_338;
  string local_318;
  allocator<char> local_2f1;
  key_type local_2f0;
  allocator<char> local_2c9;
  key_type local_2c8;
  allocator<char> local_2a1;
  key_type local_2a0;
  allocator<char> local_279;
  key_type local_278;
  allocator<char> local_251;
  key_type local_250;
  string local_230;
  allocator<char> local_209;
  key_type local_208;
  bool local_1e1;
  iterator iStack_1e0;
  bool use_mpi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  byte local_1b9;
  iterator iStack_1b8;
  bool have_pthread;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  byte local_191;
  iterator iStack_190;
  bool have_adiak;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  byte local_169;
  undefined1 local_168 [7];
  bool have_mpi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avail_services;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator<char> local_121;
  undefined1 local_120 [8];
  string ext;
  size_type pos;
  string output;
  double freq;
  undefined1 local_a8 [8];
  string query;
  key_type local_80;
  undefined1 local_50 [8];
  string freqstr;
  string *format_spec_local;
  Options *opts_local;
  config_map_t *initial_cfg_local;
  char *name_local;
  HatchetSampleProfileController *this_local;
  
  freqstr.field_2._8_8_ = format_spec;
  cali::ChannelController::ChannelController(&this->super_ChannelController,name,0,initial_cfg);
  (this->super_ChannelController)._vptr_ChannelController = (_func_int **)&PTR_on_create_00550040;
  cali::ConfigManager::Options::get_abi_cxx11_((string *)local_50,opts,"sample.frequency","200");
  pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CALI_SAMPLER_FREQUENCY",
             (allocator<char> *)(query.field_2._M_local_buf + 0xf));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pcVar2,&local_80);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_50);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)(query.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8," select path,count()",(allocator<char> *)((long)&freq + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&freq + 7));
  dVar5 = std::__cxx11::stod((string *)local_50,(size_t *)0x0);
  if (0.0 < dVar5) {
    std::__cxx11::string::append(local_a8);
    std::__cxx11::to_string((string *)((long)&output.field_2 + 8),1.0 / dVar5);
    std::__cxx11::string::append((string *)local_a8);
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::append(local_a8);
  }
  psVar4 = (string *)std::__cxx11::string::append(local_a8);
  std::__cxx11::string::append(psVar4);
  cali::ConfigManager::Options::get_abi_cxx11_((string *)&pos,opts,"output","sample_profile");
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
                          "stdout");
  if ((bVar1) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &pos,"stderr"), bVar1)) {
    ext.field_2._8_8_ = std::__cxx11::string::find_last_of((char)&pos,0x2e);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            freqstr.field_2._8_8_,"cali");
    if (bVar1) {
      local_420 = ".cali";
    }
    else {
      local_420 = ".json";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_120,local_420,&local_121);
    std::allocator<char>::~allocator(&local_121);
    avail_services.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    local_431 = true;
    if (ext.field_2._8_8_ != -1) {
      std::__cxx11::string::substr((ulong)&local_148,(ulong)&pos);
      avail_services.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      local_431 = std::operator!=(&local_148,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_120);
    }
    if ((avail_services.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_148);
    }
    if (local_431 != false) {
      std::__cxx11::string::append((string *)&pos);
    }
    std::__cxx11::string::~string((string *)local_120);
  }
  cali::services::get_available_services_abi_cxx11_();
  local_180._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_168);
  local_178 = std::
              find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[10]>
                        (local_180,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_188,(char (*) [10])0x4958f0);
  iStack_190 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_168);
  local_169 = __gnu_cxx::operator!=(&local_178,&stack0xfffffffffffffe70);
  local_1a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168);
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_168);
  local_1a0 = std::
              find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[13]>
                        (local_1a8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_1b0,(char (*) [13])0x4957e1);
  iStack_1b8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_168);
  local_191 = __gnu_cxx::operator!=(&local_1a0,&stack0xfffffffffffffe48);
  local_1d0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_168);
  local_1c8 = std::
              find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[8]>
                        (local_1d0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_1d8,(char (*) [8])0x496a06);
  iStack_1e0 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_168);
  local_1b9 = __gnu_cxx::operator!=(&local_1c8,&stack0xfffffffffffffe20);
  local_1e1 = (bool)(local_169 & 1);
  bVar1 = cali::ConfigManager::Options::is_set(opts,"use.mpi");
  if (bVar1) {
    local_46a = false;
    if ((local_169 & 1) != 0) {
      local_46a = cali::ConfigManager::Options::is_enabled(opts,"use.mpi");
    }
    local_1e1 = local_46a;
  }
  if ((local_191 & 1) != 0) {
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"CALI_SERVICES_ENABLE",&local_209);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_208);
    std::__cxx11::string::append((char *)pmVar3);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    cali::ConfigManager::Options::get_abi_cxx11_(&local_230,opts,"adiak.import_categories","2,3");
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"CALI_ADIAK_IMPORT_CATEGORIES",&local_251);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_250);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::__cxx11::string::~string((string *)&local_230);
  }
  if ((local_1b9 & 1) != 0) {
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"CALI_SERVICES_ENABLE",&local_279);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_278);
    std::__cxx11::string::append((char *)pmVar3);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
  }
  if ((local_1e1 & 1U) == 0) {
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"CALI_SERVICES_ENABLE",&local_361);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_360);
    std::__cxx11::string::append((char *)pmVar3);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"CALI_REPORT_FILENAME",&local_389);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_388);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&pos);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator(&local_389);
    cali::ConfigManager::Options::build_query(&local_3b0,opts,"local",(string *)local_a8);
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"CALI_REPORT_CONFIG",&local_3d1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_3d0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    std::__cxx11::string::~string((string *)&local_3b0);
  }
  else {
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"CALI_SERVICES_ENABLE",&local_2a1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_2a0);
    std::__cxx11::string::append((char *)pmVar3);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"CALI_MPIREPORT_FILENAME",&local_2c9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_2c8);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&pos);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"CALI_MPIREPORT_WRITE_ON_FINALIZE",&local_2f1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_2f0);
    std::__cxx11::string::operator=((string *)pmVar3,"false");
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    cali::ConfigManager::Options::build_query(&local_318,opts,"local",(string *)local_a8);
    pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"CALI_MPIREPORT_CONFIG",&local_339);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar2,&local_338);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::__cxx11::string::~string((string *)&local_318);
  }
  pcVar2 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
  cali::ConfigManager::Options::update_channel_config(opts,pcVar2);
  metadata = cali::ChannelController::metadata_abi_cxx11_(&this->super_ChannelController);
  cali::ConfigManager::Options::update_channel_metadata(opts,metadata);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  std::__cxx11::string::~string((string *)&pos);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

HatchetSampleProfileController(
        const char*                         name,
        const config_map_t&                 initial_cfg,
        const cali::ConfigManager::Options& opts,
        const std::string&                  format_spec
    )
        : ChannelController(name, 0, initial_cfg)
    {
        std::string freqstr = opts.get("sample.frequency", "200");

        config()["CALI_SAMPLER_FREQUENCY"] = freqstr;

        std::string query = " select path,count()";
        double      freq   = std::stod(freqstr);

        if (freq > 0) {
            query.append(",scale_count(");
            query.append(std::to_string(1.0 / freq));
            query.append(") as time unit sec");
        }

        query.append(" group by path,mpi.rank format ").append(format_spec);

        std::string output(opts.get("output", "sample_profile"));

        if (output != "stdout" && output != "stderr") {
            auto        pos = output.find_last_of('.');
            std::string ext = (format_spec == "cali" ? ".cali" : ".json");

            if (pos == std::string::npos || output.substr(pos) != ext)
                output.append(ext);
        }

        auto avail_services = services::get_available_services();
        bool have_mpi = std::find(avail_services.begin(), avail_services.end(), "mpireport") != avail_services.end();
        bool have_adiak =
            std::find(avail_services.begin(), avail_services.end(), "adiak_import") != avail_services.end();
        bool have_pthread = std::find(avail_services.begin(), avail_services.end(), "pthread") != avail_services.end();

        bool use_mpi = have_mpi;

        if (opts.is_set("use.mpi"))
            use_mpi = have_mpi && opts.is_enabled("use.mpi");

        if (have_adiak) {
            config()["CALI_SERVICES_ENABLE"].append(",adiak_import");
            config()["CALI_ADIAK_IMPORT_CATEGORIES"] = opts.get("adiak.import_categories", "2,3");
        }

        if (have_pthread)
            config()["CALI_SERVICES_ENABLE"].append(",pthread");

        if (use_mpi) {
            config()["CALI_SERVICES_ENABLE"].append(",mpi,mpireport");
            config()["CALI_MPIREPORT_FILENAME"]          = output;
            config()["CALI_MPIREPORT_WRITE_ON_FINALIZE"] = "false";
            config()["CALI_MPIREPORT_CONFIG"]            = opts.build_query("local", query);
        } else {
            config()["CALI_SERVICES_ENABLE"].append(",report");
            config()["CALI_REPORT_FILENAME"] = output;
            config()["CALI_REPORT_CONFIG"]   = opts.build_query("local", query); 
        }

        opts.update_channel_config(config());
        opts.update_channel_metadata(metadata());
    }